

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddExtension<google::protobuf::FieldDescriptorProto>
          (DescriptorIndex *this,StringPiece filename,FieldDescriptorProto *field)

{
  size_t size;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __first;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __last;
  bool bVar2;
  bool bVar3;
  LogMessage *pLVar4;
  undefined8 *puVar5;
  pair<std::_Rb_tree_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_bool>
  pVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_t local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_a0;
  StringPiece local_78;
  undefined1 local_68 [24];
  char local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_78.length_ = filename.length_;
  local_78.ptr_ = filename.ptr_;
  puVar5 = (undefined8 *)((ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  size = puVar5[1];
  bVar2 = true;
  if ((size != 0) &&
     (paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar5, paVar1->_M_local_buf[0] == '.')) {
    local_68._0_4_ =
         (int)((ulong)((long)(this->all_values_).
                             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->all_values_).
                            super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
         LOGLEVEL_WARNING;
    if ((long)size < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
    }
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
    local_a0.first._M_string_length = size;
    stringpiece_internal::StringPiece::ToString_abi_cxx11_
              ((string *)(local_68 + 8),(StringPiece *)&local_a0);
    local_40._M_allocated_capacity._0_4_ = field->number_;
    pVar6 = std::
            _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>
            ::
            _M_insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_const&>
                      ((_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>
                        *)&this->by_extension_,(ExtensionEntry *)local_68);
    bVar3 = true;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __first._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::substr
                ((ulong)&local_c0,(ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_a0.second = field->number_;
      paVar1 = &local_a0.first.field_2;
      if (local_c0 == &local_b0) {
        local_a0.first.field_2._8_8_ = local_b0._8_8_;
        local_a0.first._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.first._M_dataplus._M_p = (pointer)local_c0;
      }
      local_a0.first._M_string_length = local_b8;
      local_b8 = 0;
      local_b0._M_local_buf[0] = '\0';
      local_c0 = &local_b0;
      bVar3 = std::
              binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::pair<std::__cxx11::string,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                        (__first,__last,&local_a0,
                         (this->by_extension_)._M_t._M_impl.
                         super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                         ._M_key_compare.index);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0.first._M_dataplus._M_p);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
    }
    if ((char *)local_68._8_8_ != local_50) {
      operator_delete((void *)local_68._8_8_);
    }
    bVar2 = true;
    if (bVar3 != false) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x2f4);
      pLVar4 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,
                          "Extension conflicts with extension already in database: extend ");
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,(string *)
                                 ((ulong)(field->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      pLVar4 = internal::LogMessage::operator<<(pLVar4," { ");
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,(string *)
                                 ((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      pLVar4 = internal::LogMessage::operator<<(pLVar4," = ");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,field->number_);
      pLVar4 = internal::LogMessage::operator<<(pLVar4," } from:");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_78);
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddExtension(
    StringPiece filename, const FieldProto& field) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            ExtensionEntry{static_cast<int>(all_values_.size() - 1),
                           EncodeString(field.extendee()), field.number()}) ||
        std::binary_search(
            by_extension_flat_.begin(), by_extension_flat_.end(),
            std::make_pair(field.extendee().substr(1), field.number()),
            by_extension_.key_comp())) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}